

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadrb.c
# Opt level: O1

void sreadrb(int *nrow,int *ncol,int_t *nonz,float **nzval,int_t **rowind,int_t **colptr)

{
  long lVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  int_t *addr;
  FILE *__stream;
  uint uVar5;
  byte *pbVar6;
  int_t *piVar7;
  int_t *piVar8;
  int_t *addr_00;
  void *addr_01;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  long lVar18;
  float *addr_02;
  int_t *addr_03;
  byte *__nptr;
  long lVar19;
  int iVar20;
  double dVar21;
  int tmp;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf_1 [100];
  char buf [100];
  int local_248;
  int local_21c;
  float **local_218;
  int_t **local_210;
  int_t **local_208;
  int_t *local_200;
  int_t *local_1f8;
  float *local_1f0;
  float *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined1 local_1cc;
  byte local_1cb;
  undefined1 local_1c9;
  long local_1c8;
  int_t *local_1c0;
  ulong local_1b8;
  float *local_1b0;
  int_t *local_1a8;
  float *local_1a0;
  byte local_198 [256];
  byte local_98 [14];
  undefined1 local_8a;
  
  __stream = _stdin;
  local_218 = nzval;
  local_210 = rowind;
  local_208 = colptr;
  fgets((char *)local_98,100,_stdin);
  fputs((char *)local_98,_stdout);
  iVar20 = 4;
  iVar13 = 0;
  do {
    __isoc99_fscanf(__stream,"%14c",local_98);
    local_8a = 0;
    __isoc99_sscanf(local_98,"%d",&local_21c);
    if (iVar20 == 1) {
      iVar13 = local_21c;
    }
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  __isoc99_fscanf(__stream,"%3c",&local_1cc);
  pbVar6 = local_98;
  __isoc99_fscanf(__stream,"%11c",pbVar6);
  local_1c9 = 0;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  iVar20 = atoi((char *)pbVar6);
  *nrow = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  iVar20 = atoi((char *)pbVar6);
  *ncol = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  iVar20 = atoi((char *)pbVar6);
  *nonz = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  local_21c = atoi((char *)pbVar6);
  if (local_21c != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  sallocateA(*ncol,*nonz,local_218,local_210,local_208);
  __isoc99_fscanf(__stream,"%16c",pbVar6);
  sParseIntFormat((char *)pbVar6,&local_1d0,&local_1d4);
  __isoc99_fscanf(__stream,"%16c",pbVar6);
  sParseIntFormat((char *)pbVar6,&local_1d8,&local_1dc);
  __isoc99_fscanf(__stream,"%20c",pbVar6);
  do {
    bVar3 = *pbVar6;
    pbVar6 = pbVar6 + 1;
  } while (bVar3 != 0x28);
  local_248 = atoi((char *)pbVar6);
  while( true ) {
    do {
      __nptr = pbVar6 + 1;
      uVar5 = *pbVar6 - 0x44;
      pbVar6 = __nptr;
    } while (0x2c < uVar5);
    if ((0x700000007U >> ((ulong)uVar5 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
      local_248 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar6 != 0x29 && (*pbVar6 != 0x2e)); pbVar6 = pbVar6 + 1) {
  }
  *pbVar6 = 0;
  uVar5 = atoi((char *)__nptr);
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  ReadVector((FILE *)__stream,*ncol + 1,*local_208,local_1d0,local_1d4);
  ReadVector((FILE *)__stream,*nonz,*local_210,local_1d8,local_1dc);
  if (iVar13 != 0) {
    iVar13 = *nonz;
    if (0 < (long)iVar13) {
      local_1e8 = *local_218;
      local_1f0 = (float *)(long)local_248;
      lVar19 = 0;
      do {
        fgets((char *)local_198,100,__stream);
        if (0 < local_248) {
          lVar19 = (long)(int)lVar19;
          uVar12 = 0;
          lVar15 = 0;
          do {
            lVar1 = lVar15 + 1;
            lVar18 = lVar1 * (int)uVar5;
            bVar3 = local_198[lVar18];
            local_198[lVar18] = 0;
            if (0 < (int)uVar5) {
              uVar11 = 0;
              do {
                if ((local_198[uVar11 + uVar12] | 0x20) == 100) {
                  local_198[uVar11 + uVar12] = 0x45;
                }
                uVar11 = uVar11 + 1;
              } while (uVar5 != uVar11);
            }
            dVar21 = atof((char *)(local_198 + lVar15 * (int)uVar5));
            local_1e8[lVar19] = (float)dVar21;
            lVar19 = lVar19 + 1;
            local_198[lVar18] = bVar3;
          } while ((lVar1 < (long)local_1f0) &&
                  (uVar12 = uVar12 + uVar5, lVar15 = lVar1, lVar19 < iVar13));
        }
      } while ((int)lVar19 < iVar13);
    }
  }
  if ((local_1cb & 0xdf) != 0x53) goto LAB_0010581c;
  uVar5 = *ncol;
  uVar11 = (ulong)uVar5;
  addr_03 = *local_210;
  addr = *local_208;
  addr_02 = *local_218;
  iVar13 = uVar5 + 1;
  piVar7 = intMalloc(iVar13);
  if (piVar7 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xc9,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  piVar8 = intMalloc(iVar13);
  if (piVar8 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcb,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  addr_00 = intMalloc(*nonz);
  if (addr_00 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",
            0xcd,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  addr_01 = superlu_malloc((long)*nonz << 2);
  if (addr_01 == (void *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xcf,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  local_200 = piVar8;
  if ((int)uVar5 < 1) {
    *piVar8 = 0;
LAB_001054b4:
    if (0 < (int)uVar5) {
      uVar10 = 0;
      do {
        lVar19 = (long)addr[uVar10];
        uVar14 = uVar10 + 1;
        if (addr[uVar10] < addr[uVar10 + 1]) {
          do {
            iVar20 = addr_03[lVar19];
            addr_00[piVar7[iVar20]] = (int_t)uVar10;
            iVar4 = piVar7[iVar20];
            *(float *)((long)addr_01 + (long)iVar4 * 4) = addr_02[lVar19];
            piVar7[iVar20] = iVar4 + 1;
            lVar19 = lVar19 + 1;
          } while (lVar19 < addr[uVar14]);
        }
        uVar10 = uVar14;
      } while (uVar14 != uVar11);
    }
  }
  else {
    memset(piVar7,0,uVar11 * 4);
    uVar10 = 0;
    do {
      lVar19 = (long)addr[uVar10];
      uVar14 = uVar10 + 1;
      if (addr[uVar10] < addr[uVar10 + 1]) {
        do {
          piVar7[addr_03[lVar19]] = piVar7[addr_03[lVar19]] + 1;
          lVar19 = lVar19 + 1;
        } while (lVar19 < addr[uVar14]);
      }
      uVar10 = uVar14;
    } while (uVar14 != uVar11);
    *local_200 = 0;
    if (0 < (int)uVar5) {
      uVar10 = 0;
      do {
        local_200[uVar10 + 1] = piVar7[uVar10] + local_200[uVar10];
        piVar7[uVar10] = local_200[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar10);
      goto LAB_001054b4;
    }
  }
  piVar8 = local_200;
  lVar19 = (long)*nonz * 2 - (long)(int)uVar5;
  local_1f8 = intMalloc(iVar13);
  if (local_1f8 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xe8,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  local_1c0 = piVar7;
  piVar7 = intMalloc((int_t)lVar19);
  if (piVar7 == (int_t *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",
            0xea,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  local_1c8 = lVar19;
  pfVar9 = (float *)superlu_malloc(lVar19 * 4);
  if (pfVar9 == (float *)0x0) {
    sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xec,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
    superlu_abort_and_exit((char *)local_198);
  }
  *local_1f8 = 0;
  if (0 < (int)uVar5) {
    pfVar17 = (float *)0x0;
    uVar10 = 0;
    local_1b8 = uVar11;
    local_1b0 = addr_02;
    local_1a8 = addr_03;
    do {
      lVar19 = (long)piVar8[uVar10];
      uVar14 = uVar10 + 1;
      if (piVar8[uVar10] < piVar8[uVar10 + 1]) {
        do {
          if (uVar10 != (uint)addr_00[lVar19]) {
            iVar13 = (int)pfVar17;
            piVar7[iVar13] = addr_00[lVar19];
            pfVar9[iVar13] = *(float *)((long)addr_01 + lVar19 * 4);
            pfVar17 = (float *)(ulong)(iVar13 + 1);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < piVar8[uVar14]);
      }
      lVar19 = (long)addr[uVar10];
      if (addr[uVar10] < addr[uVar14]) {
        pfVar16 = pfVar9 + (int)pfVar17;
        lVar15 = 0;
        local_1f0 = pfVar16;
        local_1e8 = pfVar17;
        local_1a0 = pfVar17;
        do {
          piVar7[(int)pfVar17 + lVar15] = addr_03[lVar19 + lVar15];
          fVar2 = addr_02[lVar19 + lVar15];
          pfVar16[lVar15] = fVar2;
          if (ABS(fVar2) <= 0.0 && ABS(fVar2) != 0.0) {
            printf("%5d: %e\n",(ulong)(uint)((int)local_1e8 + (int)lVar15));
            pfVar16 = local_1f0;
          }
          lVar1 = lVar19 + lVar15;
          lVar15 = lVar15 + 1;
        } while (lVar1 + 1 < (long)addr[uVar14]);
        pfVar17 = (float *)(ulong)(uint)((int)local_1a0 + (int)lVar15);
        piVar8 = local_200;
        uVar11 = local_1b8;
        addr_02 = local_1b0;
        addr_03 = local_1a8;
      }
      local_1f8[uVar14] = (int_t)pfVar17;
      uVar10 = uVar14;
    } while (uVar14 != uVar11);
  }
  lVar19 = local_1c8;
  printf("FormFullA: new_nnz = %lld\n",local_1c8);
  superlu_free(addr_02);
  superlu_free(addr_03);
  superlu_free(addr);
  superlu_free(local_1c0);
  superlu_free(addr_01);
  superlu_free(addr_00);
  superlu_free(local_200);
  *local_218 = pfVar9;
  *local_210 = piVar7;
  *local_208 = local_1f8;
  *nonz = (int_t)lVar19;
LAB_0010581c:
  fclose(__stream);
  return;
}

Assistant:

void
sreadrb(int *nrow, int *ncol, int_t *nonz,
        float **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    sDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    sDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    sallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    sParseFloatFormat(buf, &valnum, &valsize);
    sDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        sReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}